

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t assignBuf(ion_bpp_handle_t handle,ion_bpp_address_t adr,ion_bpp_buffer_t **b)

{
  ion_bpp_buffer_tag *piVar1;
  ion_bpp_buffer_tag *piVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_buffer_tag *piVar4;
  ion_bpp_buffer_t *piVar5;
  
  if (adr == 0) {
    piVar5 = (ion_bpp_buffer_t *)((long)handle + 0x20);
  }
  else {
    piVar1 = (ion_bpp_buffer_tag *)((long)handle + 0x48);
    piVar5 = *(ion_bpp_buffer_t **)((long)handle + 0x48);
    piVar4 = (*(ion_bpp_buffer_t **)((long)handle + 0x48))->next;
    while ((piVar4 != piVar1 && ((piVar5->valid == boolean_false || (piVar5->adr != adr))))) {
      piVar5 = piVar4;
      piVar4 = piVar4->next;
    }
    if (piVar5->valid == boolean_false) {
      piVar5->adr = adr;
    }
    else if (piVar5->adr != adr) {
      if (piVar5->modified != boolean_false) {
        iVar3 = flush(*handle,(ion_bpp_buffer_t *)(ulong)*(uint *)((long)handle + 0x10));
        if (iVar3 != bErrOk) {
          return iVar3;
        }
        piVar4 = piVar5->next;
      }
      piVar5->adr = adr;
      piVar5->valid = boolean_false;
    }
    piVar2 = piVar5->prev;
    piVar4->prev = piVar2;
    piVar2->next = piVar4;
    piVar4 = piVar1->next;
    piVar5->next = piVar4;
    piVar5->prev = piVar1;
    piVar4->prev = piVar5;
    piVar5->prev->next = piVar5;
  }
  *b = piVar5;
  return bErrOk;
}

Assistant:

static ion_bpp_err_t
assignBuf(
	ion_bpp_handle_t	handle,
	ion_bpp_address_t	adr,
	ion_bpp_buffer_t	**b
) {
	ion_bpp_h_node_t *h = handle;
	/* assign buf to adr */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	if (adr == 0) {
		*b = &h->root;
		return bErrOk;
	}

	/* search for buf with matching adr */
	buf = h->bufList.next;

	while (buf->next != &h->bufList) {
		if (buf->valid && (buf->adr == adr)) {
			break;
		}

		buf = buf->next;
	}

	/* either buf points to a match, or it's last one in list (LRR) */
	if (buf->valid) {
		if (buf->adr != adr) {
			if (buf->modified) {
				if ((rc = flush(handle, buf)) != 0) {
					return rc;
				}
			}

			buf->adr	= adr;
			buf->valid	= boolean_false;
		}
	}
	else {
		buf->adr = adr;
	}

	/* remove from current position and place at front of list */
	buf->next->prev = buf->prev;
	buf->prev->next = buf->next;
	buf->next		= h->bufList.next;
	buf->prev		= &h->bufList;
	buf->next->prev = buf;
	buf->prev->next = buf;
	*b				= buf;
	return bErrOk;
}